

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.c
# Opt level: O1

void translator_loop_mipsel
               (TranslatorOps_conflict1 *ops,DisasContextBase_conflict1 *db,CPUState *cpu,
               TranslationBlock_conflict *tb,int max_insns)

{
  target_ulong_conflict tVar1;
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *tcg_ctx;
  hook *phVar2;
  TranslationBlock_conflict *pTVar3;
  void *pvVar4;
  _Bool _Var5;
  uint uVar6;
  uintptr_t o_1;
  undefined1 *puVar7;
  TCGLabel *pTVar8;
  TCGTemp *pTVar9;
  TCGv_i32 pTVar10;
  TCGv_i64 pTVar11;
  TCGv_i64 pTVar12;
  gpointer pvVar13;
  ulong *puVar14;
  list_item *plVar15;
  uintptr_t o_2;
  TCGTemp *pTVar16;
  CPUBreakpoint *pCVar17;
  ulong uVar18;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar19;
  uintptr_t o;
  TCGTemp *ts;
  bool bVar20;
  int local_a8;
  void *local_a0;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TranslatorOps_conflict1 *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = cpu->uc;
  tcg_ctx = val->tcg_ctx;
  db->tb = tb;
  tVar1 = tb->pc;
  db->pc_first = tVar1;
  db->pc_next = tVar1;
  db->is_jmp = DISAS_NEXT;
  db->num_insns = 0;
  db->max_insns = max_insns;
  db->singlestep_enabled = cpu->singlestep_enabled != 0;
  (*ops->init_disas_context)(db,cpu);
  local_88 = (TCGTemp *)(ulong)tb->pc;
  if (val->use_exits == 0) {
    bVar20 = (TCGTemp *)val->exits[(long)val->nested_level + -1] == local_88;
  }
  else {
    puVar7 = (undefined1 *)g_tree_lookup(val->ctl_exits,&local_88);
    bVar20 = puVar7 == &DAT_00000001;
  }
  if (bVar20) {
    pTVar8 = gen_new_label_mipsel((TCGContext_conflict4 *)tcg_ctx);
    tcg_ctx->exitreq_label = pTVar8;
    local_a8 = 0;
    pTVar9 = tcg_temp_new_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_op3_mipsel((TCGContext_conflict4 *)tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar9,
                       (long)&tcg_ctx->pool_cur + tcg_ctx->gen_insn_data[0x102][1],
                       0xfffffffffffffff0);
    tcg_gen_brcondi_i32_mipsel
              ((TCGContext_conflict4 *)tcg_ctx,TCG_COND_LT,(TCGv_i32)((long)pTVar9 - (long)tcg_ctx),
               0,tcg_ctx->exitreq_label);
    tcg_temp_free_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,pTVar9);
    (*ops->tb_start)(db,cpu);
    db->num_insns = db->num_insns + 1;
    (*ops->insn_start)(db,cpu);
    (*ops->translate_insn)(db,cpu);
    local_a0 = (void *)0x0;
    bVar20 = false;
  }
  else {
    plVar15 = val->hook[3].head;
    bVar20 = plVar15 != (list_item *)0x0;
    if (bVar20) {
      do {
        pvVar4 = plVar15->data;
        if ((((*(ulong *)((long)pvVar4 + 0x18) <= (ulong)tb->pc) &&
             ((ulong)tb->pc <= *(ulong *)((long)pvVar4 + 0x20))) ||
            (*(ulong *)((long)pvVar4 + 0x20) < *(ulong *)((long)pvVar4 + 0x18))) &&
           (*(char *)((long)pvVar4 + 0x14) != '\x01')) break;
        plVar15 = plVar15->next;
        bVar20 = plVar15 != (list_item *)0x0;
      } while (bVar20);
    }
    local_60 = ops;
    if (bVar20) {
      local_a0 = ((tcg_ctx->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
      uVar6 = db->pc_first;
      pTVar10 = tcg_const_i32_mipsel((TCGContext_conflict4 *)tcg_ctx,-0x7070708);
      pTVar11 = tcg_const_i64_mipsel((TCGContext_conflict4 *)tcg_ctx,(int64_t)val);
      pTVar12 = tcg_const_i64_mipsel((TCGContext_conflict4 *)tcg_ctx,(ulong)uVar6);
      ts = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
      pTVar9 = (TCGTemp *)(pTVar12 + (long)tcg_ctx);
      pTVar16 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
      local_40 = (TCGTemp *)0x0;
      local_68 = pTVar16;
      local_58 = ts;
      local_50 = pTVar9;
      local_48 = pTVar16;
      if (val->hooks_count[3] == 1) {
        for (plVar15 = val->hook[3].head; plVar15 != (list_item *)0x0; plVar15 = plVar15->next) {
          phVar2 = (hook *)plVar15->data;
          if (phVar2->to_delete == false) {
            pTVar11 = tcg_const_i64_mipsel
                                ((TCGContext_conflict4 *)tcg_ctx,(int64_t)phVar2->user_data);
            local_40 = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
            (*val->add_inline_hook)(val,phVar2,&local_58,4);
            tcg_temp_free_internal_mipsel
                      ((TCGContext_conflict4 *)tcg_ctx,(TCGTemp *)(pTVar11 + (long)tcg_ctx));
          }
        }
      }
      else {
        pTVar10 = tcg_const_i32_mipsel((TCGContext_conflict4 *)tcg_ctx,3);
        local_88 = pTVar16;
        local_80 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
        local_78 = ts;
        local_70 = pTVar9;
        tcg_gen_callN_mipsel
                  ((TCGContext_conflict4 *)tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_88);
        tcg_temp_free_internal_mipsel
                  ((TCGContext_conflict4 *)tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
      }
      tcg_temp_free_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,pTVar9);
      tcg_temp_free_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,ts);
      tcg_temp_free_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,local_68);
      bVar20 = true;
    }
    else {
      local_a0 = (void *)0x0;
      bVar20 = false;
    }
    local_a8 = 0;
    pTVar8 = gen_new_label_mipsel((TCGContext_conflict4 *)tcg_ctx);
    tcg_ctx->exitreq_label = pTVar8;
    pTVar9 = tcg_temp_new_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_op3_mipsel((TCGContext_conflict4 *)tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar9,
                       (long)&tcg_ctx->pool_cur + tcg_ctx->gen_insn_data[0x102][1],
                       0xfffffffffffffff0);
    tcg_gen_brcondi_i32_mipsel
              ((TCGContext_conflict4 *)tcg_ctx,TCG_COND_LT,(TCGv_i32)((long)pTVar9 - (long)tcg_ctx),
               0,tcg_ctx->exitreq_label);
    tcg_temp_free_internal_mipsel((TCGContext_conflict4 *)tcg_ctx,pTVar9);
    ops = local_60;
    (*local_60->tb_start)(db,cpu);
    do {
      db->num_insns = db->num_insns + 1;
      (*ops->insn_start)(db,cpu);
      if ((db->singlestep_enabled == false) &&
         (pCVar17 = (cpu->breakpoints).tqh_first, pCVar17 != (CPUBreakpoint *)0x0)) {
        do {
          if ((pCVar17->pc == (ulong)db->pc_next) &&
             (_Var5 = (*ops->breakpoint_check)(db,cpu,pCVar17), _Var5)) {
            local_a8 = 1;
            break;
          }
          pCVar17 = (pCVar17->entry).tqe_next;
        } while (pCVar17 != (CPUBreakpoint *)0x0);
        if (DISAS_TOO_MANY < db->is_jmp) goto LAB_00867398;
      }
      (*ops->translate_insn)(db,cpu);
      if (db->is_jmp != DISAS_NEXT) goto LAB_00867398;
    } while ((tcg_ctx->nb_ops < 4000) && (db->num_insns < db->max_insns));
    db->is_jmp = DISAS_TOO_MANY;
  }
LAB_00867398:
  (*ops->tb_stop)(db,cpu);
  pTVar3 = db->tb;
  if ((pTVar3->cflags & 0x20000) != 0) {
    *(long *)(tcg_ctx->gen_insn_data[0x101][1] + 0x20) = (long)db->num_insns - (long)local_a8;
  }
  pTVar8 = tcg_ctx->exitreq_label;
  *(uint *)pTVar8 = *(uint *)pTVar8 | 1;
  tcg_gen_op1_mipsel((TCGContext_conflict4 *)tcg_ctx,INDEX_op_set_label,(TCGArg)pTVar8);
  tcg_gen_exit_tb_mipsel((TCGContext_conflict4 *)tcg_ctx,pTVar3,3);
  uVar6 = db->pc_next - db->pc_first;
  pTVar3 = db->tb;
  pTVar3->size = (uint16_t)uVar6;
  pTVar3->icount = (uint16_t)db->num_insns;
  pTVar9 = (TCGTemp *)(ulong)pTVar3->pc;
  uVar18 = (ulong)(uVar6 & 0xffff);
  for (plVar15 = val->hook[2].head; plVar15 != (list_item *)0x0; plVar15 = plVar15->next) {
    pvVar4 = plVar15->data;
    if ((((*(TCGTemp **)((long)pvVar4 + 0x18) <= pTVar9) &&
         (pTVar9 <= *(TCGTemp **)((long)pvVar4 + 0x20))) ||
        (*(TCGTemp **)((long)pvVar4 + 0x20) < *(TCGTemp **)((long)pvVar4 + 0x18))) &&
       ((*(char *)((long)pvVar4 + 0x14) == '\0' &&
        (local_88 = pTVar9, local_80 = (TCGTemp *)uVar18,
        pvVar13 = g_hash_table_lookup(*(GHashTable **)((long)pvVar4 + 0x38),&local_88),
        pvVar13 == (gpointer)0x0)))) {
      puVar14 = (ulong *)malloc(0x10);
      *puVar14 = (ulong)pTVar9;
      puVar14[1] = uVar18;
      g_hash_table_insert(*(GHashTable **)((long)pvVar4 + 0x38),puVar14,&DAT_00000001);
    }
  }
  for (plVar15 = val->hook[3].head; plVar15 != (list_item *)0x0; plVar15 = plVar15->next) {
    pvVar4 = plVar15->data;
    if ((((*(TCGTemp **)((long)pvVar4 + 0x18) <= pTVar9) &&
         (pTVar9 <= *(TCGTemp **)((long)pvVar4 + 0x20))) ||
        (*(TCGTemp **)((long)pvVar4 + 0x20) < *(TCGTemp **)((long)pvVar4 + 0x18))) &&
       ((*(char *)((long)pvVar4 + 0x14) == '\0' &&
        (local_88 = pTVar9, local_80 = (TCGTemp *)uVar18,
        pvVar13 = g_hash_table_lookup(*(GHashTable **)((long)pvVar4 + 0x38),&local_88),
        pvVar13 == (gpointer)0x0)))) {
      puVar14 = (ulong *)malloc(0x10);
      *puVar14 = (ulong)pTVar9;
      puVar14[1] = uVar18;
      g_hash_table_insert(*(GHashTable **)((long)pvVar4 + 0x38),puVar14,&DAT_00000001);
    }
  }
  if (bVar20) {
    paVar19 = &tcg_ctx->ops;
    if (local_a0 != (void *)0x0) {
      paVar19 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_a0 + 8);
    }
    paVar19->tqh_first->args[1] = (ulong)db->tb->size;
  }
  return;
}

Assistant:

void translator_loop(const TranslatorOps *ops, DisasContextBase *db,
                     CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    int bp_insn = 0;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *prev_op = NULL;
    bool block_hook = false;

    /* Initialize DisasContext */
    db->tb = tb;
    db->pc_first = tb->pc;
    db->pc_next = db->pc_first;
    db->is_jmp = DISAS_NEXT;
    db->num_insns = 0;
    db->max_insns = max_insns;
    db->singlestep_enabled = cpu->singlestep_enabled;

    ops->init_disas_context(db, cpu);
    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    /* Reset the temp count so that we can identify leaks */
    tcg_clear_temp_count();

    /* Unicorn: early check to see if the address of this block is
     * the "run until" address. */
    if (uc_addr_is_exit(uc, tb->pc)) {
        // This should catch that instruction is at the end
        // and generate appropriate halting code.
        gen_tb_start(tcg_ctx, db->tb);
        ops->tb_start(db, cpu);
        db->num_insns++;
        ops->insn_start(db, cpu);
        ops->translate_insn(db, cpu);
        goto _end_loop;
    }

    /* Unicorn: trace this block on request
     * Only hook this block if it is not broken from previous translation due to
     * full translation cache
     */
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_BLOCK, tb->pc)) {
        prev_op = tcg_last_op(tcg_ctx);
        block_hook = true;
        gen_uc_tracecode(tcg_ctx, 0xf8f8f8f8, UC_HOOK_BLOCK_IDX, uc, db->pc_first);
    }

    // tcg_dump_ops(tcg_ctx, false, "translator loop");

    /* Start translating.  */
    gen_tb_start(tcg_ctx, db->tb);
    // tcg_dump_ops(tcg_ctx, false, "tb start");

    ops->tb_start(db, cpu);
    // tcg_dump_ops(tcg_ctx, false, "tb start 2");

    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    while (true) {
        db->num_insns++;

        ops->insn_start(db, cpu);
        tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

        /* Pass breakpoint hits to target for further processing */
        if (!db->singlestep_enabled
            && unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
            CPUBreakpoint *bp;
            QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
                if (bp->pc == db->pc_next) {
                    if (ops->breakpoint_check(db, cpu, bp)) {
                        bp_insn = 1;
                        break;
                    }
                }
            }
            /* The breakpoint_check hook may use DISAS_TOO_MANY to indicate
               that only one more instruction is to be executed.  Otherwise
               it should use DISAS_NORETURN when generating an exception,
               but may use a DISAS_TARGET_* value for Something Else.  */
            if (db->is_jmp > DISAS_TOO_MANY) {
                break;
            }
        }

        /* Disassemble one instruction.  The translate_insn hook should
           update db->pc_next and db->is_jmp to indicate what should be
           done next -- either exiting this loop or locate the start of
           the next instruction.  */
        ops->translate_insn(db, cpu);
        // tcg_dump_ops(tcg_ctx, false, "insn translate");

        /* Stop translation if translate_insn so indicated.  */
        if (db->is_jmp != DISAS_NEXT) {
            break;
        }

        /* Stop translation if the output buffer is full,
           or we have executed all of the allowed instructions.  */
        if (tcg_op_buf_full(tcg_ctx) || db->num_insns >= db->max_insns) {
            db->is_jmp = DISAS_TOO_MANY;
            break;
        }
    }

_end_loop:
    /* Emit code to exit the TB, as indicated by db->is_jmp.  */
    ops->tb_stop(db, cpu);
    gen_tb_end(tcg_ctx, db->tb, db->num_insns - bp_insn);
    // tcg_dump_ops(tcg_ctx, false, "tb end");

    /* The disas_log hook may use these values rather than recompute.  */
    db->tb->size = db->pc_next - db->pc_first;
    db->tb->icount = db->num_insns;

    hooked_regions_check(uc, db->tb->pc, db->tb->size);

    if (block_hook) {
        TCGOp *tcg_op;

        // Unicorn: patch the callback to have the proper block size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this basic block is the first emulated code ever,
            // so the basic block operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = db->tb->size;
    }
}